

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::TextureCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  char *pcVar2;
  ostringstream buf;
  undefined1 local_190 [376];
  
  if (*(int *)((long)this + 0x84) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_out;\nvoid main ()\n{\n\tfragColor = v_out;\n}\n"
               ,"");
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\n",0x41);
  if (*(int *)((long)this + 0x88) == 1) {
    lVar1 = 0x29;
    pcVar2 = "uniform highp sampler2DShadow u_sampler;\n";
LAB_013bd58e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,lVar1);
  }
  else if (*(int *)((long)this + 0x88) == 0) {
    lVar1 = 0x23;
    pcVar2 = "uniform highp sampler2D u_sampler;\n";
    goto LAB_013bd58e;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"in highp vec4 v_attr;\nvoid main ()\n{\n",0x25);
  if (*(int *)((long)this + 0x88) == 0) {
    lVar1 = 0x5c;
    pcVar2 = 
    "\thighp vec2 a1 = texture(u_sampler, v_attr.xy).rg;\n\tfragColor = vec4(a1.x, a1.y, 1.0, 1.0);\n"
    ;
  }
  else {
    if (*(int *)((long)this + 0x88) != 1) goto LAB_013bd5e2;
    lVar1 = 0x85;
    pcVar2 = 
    "\thighp float a1 = texture(u_sampler, vec3(v_attr.xy, 0.0));\n\tfragColor = vec4(a1, (a1 > 1.0 || a1 < 0.0) ? (0.0) : (1.0), 1.0, 1.0);\n"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,lVar1);
LAB_013bd5e2:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureCase::genFragmentSource (void) const
{
	// fragment shader is passthrough
	if (m_type == TYPE_VERTEX)
		return s_colorPassthroughFragmentShaderSource;

	// fragment shader does the calculations
	std::ostringstream buf;
	buf <<	"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;\n";

	if (m_textureType == TEXTURE_FLOAT)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else if (m_textureType == TEXTURE_DEPTH)
		buf <<	"uniform highp sampler2DShadow u_sampler;\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"in highp vec4 v_attr;\n"
			"void main ()\n"
			"{\n";

	if (m_textureType == TEXTURE_FLOAT)
		buf <<	"	highp vec2 a1 = texture(u_sampler, v_attr.xy).rg;\n"
				"	fragColor = vec4(a1.x, a1.y, 1.0, 1.0);\n";
	else if (m_textureType == TEXTURE_DEPTH)
		buf <<	"	highp float a1 = texture(u_sampler, vec3(v_attr.xy, 0.0));\n"
				"	fragColor = vec4(a1, (a1 > 1.0 || a1 < 0.0) ? (0.0) : (1.0), 1.0, 1.0);\n";
	else
		DE_ASSERT(DE_FALSE);

	buf << "}\n";
	return buf.str();
}